

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,ExtPubkey *ext_pubkey,string *parent_key_information,string *path
          )

{
  ulong uVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_28;
  string *path_local;
  string *parent_key_information_local;
  ExtPubkey *ext_pubkey_local;
  DescriptorKeyInfo *this_local;
  
  this->key_type_ = kDescriptorKeyBip32;
  local_28 = path;
  path_local = parent_key_information;
  parent_key_information_local = (string *)ext_pubkey;
  ext_pubkey_local = (ExtPubkey *)this;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_,(ExtPubkey *)parent_key_information_local);
  ::std::__cxx11::string::string((string *)&this->parent_info_);
  ::std::__cxx11::string::string((string *)&this->path_);
  ::std::__cxx11::string::string((string *)&this->key_string_);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::operator=
              ((string *)&this->parent_info_,(string *)parent_key_information);
  }
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)path);
    if (*pcVar2 == '/') {
      ::std::__cxx11::string::operator=((string *)&this->path_,(string *)path);
    }
    else {
      ::std::operator+(&local_58,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path);
      ::std::__cxx11::string::operator=((string *)&this->path_,(string *)&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const ExtPubkey& ext_pubkey, const std::string parent_key_information,
    const std::string path)
    : key_type_(DescriptorKeyType::kDescriptorKeyBip32),
      extpubkey_(ext_pubkey) {
  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
  if (!path.empty()) {
    if (path[0] != '/') {
      path_ = "/" + path;
    } else {
      path_ = path;
    }
  }
}